

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O2

vector<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_int>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_int>_>_>_>
* __thiscall
pstd::
vector<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_int>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_int>_>_>_>
::operator=(vector<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_int>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_int>_>_>_>
            *this,vector<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_int>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_int>_>_>_>
                  *other)

{
  optional<std::pair<pbrt::LightHandle,_unsigned_int>_> *poVar1;
  size_t sVar2;
  size_t i;
  ulong uVar3;
  long lVar4;
  
  if (this != other) {
    if ((this->alloc).memoryResource == (other->alloc).memoryResource) {
      poVar1 = this->ptr;
      this->ptr = other->ptr;
      other->ptr = poVar1;
      sVar2 = this->nAlloc;
      this->nAlloc = other->nAlloc;
      other->nAlloc = sVar2;
      sVar2 = this->nStored;
      this->nStored = other->nStored;
      other->nStored = sVar2;
    }
    else {
      clear(this);
      reserve(this,other->nStored);
      lVar4 = 0;
      for (uVar3 = 0; uVar3 < other->nStored; uVar3 = uVar3 + 1) {
        optional<std::pair<pbrt::LightHandle,_unsigned_int>_>::optional
                  ((optional<std::pair<pbrt::LightHandle,_unsigned_int>_> *)
                   ((long)&this->ptr->optionalValue + lVar4),
                   (optional<std::pair<pbrt::LightHandle,_unsigned_int>_> *)
                   ((long)&other->ptr->optionalValue + lVar4));
        lVar4 = lVar4 + 0x18;
      }
      this->nStored = other->nStored;
    }
  }
  return this;
}

Assistant:

vector &operator=(vector &&other) {
        if (this == &other)
            return *this;

        if (alloc == other.alloc) {
            pstd::swap(ptr, other.ptr);
            pstd::swap(nAlloc, other.nAlloc);
            pstd::swap(nStored, other.nStored);
        } else {
            clear();
            reserve(other.size());
            for (size_t i = 0; i < other.size(); ++i)
                alloc.template construct<T>(ptr + i, std::move(other[i]));
            nStored = other.size();
        }

        return *this;
    }